

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void minMaxFinalize(sqlite3_context *context)

{
  Mem *pFrom;
  
  if ((context->pMem->flags & 0x2000) == 0) {
    pFrom = (Mem *)createAggContext(context,0);
  }
  else {
    pFrom = (Mem *)context->pMem->z;
  }
  if (pFrom != (Mem *)0x0) {
    if (pFrom->flags != 0) {
      sqlite3VdbeMemCopy(context->pOut,pFrom);
      if ((pFrom->flags & 0x2460) != 0) goto LAB_0016efe5;
    }
    if (pFrom->szMalloc != 0) {
LAB_0016efe5:
      vdbeMemClear(pFrom);
      return;
    }
  }
  return;
}

Assistant:

static void minMaxFinalize(sqlite3_context *context){
  sqlite3_value *pRes;
  pRes = (sqlite3_value *)sqlite3_aggregate_context(context, 0);
  if( pRes ){
    if( pRes->flags ){
      sqlite3_result_value(context, pRes);
    }
    sqlite3VdbeMemRelease(pRes);
  }
}